

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O3

bool do_write_jpeg_image(jpeg_compress_struct *cinfo,JSAMPROW *row_pointer,QImage *image,
                        QIODevice *device,int sourceQuality,QString *description,bool optimize,
                        bool progressive,bool invertCMYK)

{
  uint uVar1;
  jpeg_component_info *pjVar2;
  bool bVar3;
  bool bVar4;
  Data *pDVar5;
  qsizetype qVar6;
  UINT16 UVar7;
  int iVar8;
  JDIMENSION JVar9;
  J_COLOR_SPACE JVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  jpeg_destination_mgr *pjVar14;
  jpeg_error_mgr *pjVar15;
  _Rb_tree_node_base *p_Var16;
  size_t __n;
  JSAMPROW pJVar17;
  void *pvVar18;
  uint uVar19;
  QArrayData *pQVar20;
  char *pcVar21;
  long lVar22;
  size_t __n_00;
  long lVar23;
  P _a;
  _Rb_tree_node_base *p_Var24;
  long in_FS_OFFSET;
  bool bVar25;
  bool bVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  QByteArrayView QVar39;
  QMap<QString,_QString> text;
  my_error_mgr jerr;
  QArrayData *local_2f8;
  char *pcStack_2f0;
  qsizetype local_2e8;
  QByteArray local_2d8;
  QByteArray local_2b8;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray> local_298;
  QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
  local_258;
  QByteArray local_208;
  QByteArray local_1e8;
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  local_1c8;
  undefined8 uStack_1c0;
  long local_1b8;
  code *local_1a8 [2];
  code *local_198;
  __jmp_buf_tag local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QImage::colorTable();
  iVar8 = QImage::format();
  if ((iVar8 == 0) || (iVar8 = QImage::format(), iVar8 == 0x17)) {
    bVar25 = false;
    goto LAB_00108729;
  }
  pjVar14 = (jpeg_destination_mgr *)operator_new(0x1030);
  pjVar14->init_destination = qt_init_destination;
  pjVar14->empty_output_buffer = qt_empty_output_buffer;
  pjVar14->term_destination = qt_term_destination;
  pjVar14[1].next_output_byte = (JOCTET *)device;
  pjVar14->next_output_byte = (JOCTET *)&pjVar14[1].free_in_buffer;
  pjVar14->free_in_buffer = 0x1000;
  memset(local_1a8,0xaa,0x170);
  pjVar15 = (jpeg_error_mgr *)jpeg_std_error(local_1a8);
  cinfo->err = pjVar15;
  local_1a8[0] = my_error_exit;
  local_198 = my_output_message;
  iVar8 = _setjmp(&local_100);
  bVar25 = iVar8 == 0;
  if (bVar25) {
    jpeg_CreateCompress(cinfo,0x50,0x248);
    cinfo->dest = pjVar14;
    JVar9 = QImage::width();
    cinfo->image_width = JVar9;
    JVar9 = QImage::height();
    cinfo->image_height = JVar9;
    iVar8 = QImage::format();
    if (iVar8 < 0x18) {
      if (iVar8 - 1U < 3) {
        iVar8 = QImage::colorCount();
        if (iVar8 == 0) {
          bVar26 = true;
        }
        else {
          lVar23 = (long)iVar8;
          do {
            lVar23 = lVar23 + -1;
            uVar1 = *(uint *)(lVar23 * 4 + -0x5555555555555556);
            uVar19 = uVar1 >> 0x10 & 0xff;
            bVar3 = (uVar1 & 0xff) == uVar19;
            bVar4 = (uVar1 >> 8 & 0xff) == uVar19;
            bVar26 = bVar3 && bVar4;
            if (!bVar3 || !bVar4) break;
          } while (lVar23 != 0);
          if (!bVar3 || !bVar4) {
            cinfo->input_components = 3;
            JVar10 = JCS_RGB;
            goto LAB_0010788d;
          }
        }
        cinfo->input_components = 1;
        goto LAB_00107876;
      }
LAB_0010787d:
      cinfo->input_components = 3;
      JVar10 = JCS_RGB;
LAB_00107889:
      bVar26 = false;
    }
    else {
      if ((iVar8 != 0x18) && (iVar8 != 0x1c)) {
        if (iVar8 != 0x24) goto LAB_0010787d;
        cinfo->input_components = 4;
        JVar10 = JCS_CMYK;
        goto LAB_00107889;
      }
      cinfo->input_components = 1;
      bVar26 = true;
LAB_00107876:
      JVar10 = JCS_GRAYSCALE;
    }
LAB_0010788d:
    cinfo->in_color_space = JVar10;
    jpeg_set_defaults(cinfo);
    iVar8 = QImage::dotsPerMeterX();
    iVar11 = QImage::dotsPerMeterX();
    iVar12 = QImage::dotsPerMeterY();
    iVar13 = QImage::dotsPerMeterY();
    auVar33._0_8_ = (double)iVar8 * 2.54;
    auVar33._8_8_ = (double)iVar12 * 2.54;
    auVar33 = divpd(auVar33,_DAT_0010a0c0);
    auVar37._0_8_ = (double)iVar11 * 2.54;
    auVar37._8_8_ = (double)iVar13 * 2.54;
    auVar38 = divpd(auVar37,_DAT_0010a0c0);
    dVar31 = auVar33._0_8_ -
             (double)(int)((double)((ulong)auVar38._0_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                          + auVar38._0_8_);
    dVar34 = auVar33._8_8_ -
             (double)(int)((double)((ulong)auVar38._8_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                          + auVar38._8_8_);
    uVar27 = -(ulong)(dVar31 < -dVar31);
    uVar29 = -(ulong)(dVar34 < -dVar34);
    iVar8 = QImage::dotsPerMeterX();
    iVar11 = QImage::dotsPerMeterX();
    iVar12 = QImage::dotsPerMeterY();
    iVar13 = QImage::dotsPerMeterY();
    auVar38._0_8_ = (double)iVar8;
    auVar38._8_8_ = (double)iVar12;
    auVar36._0_8_ = (double)iVar11;
    auVar36._8_8_ = (double)iVar13;
    auVar36 = divpd(auVar36,_DAT_0010a0c0);
    auVar33 = divpd(auVar38,_DAT_0010a0c0);
    dVar32 = auVar33._0_8_ -
             (double)(int)((double)((ulong)auVar36._0_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                          + auVar36._0_8_);
    dVar35 = auVar33._8_8_ -
             (double)(int)((double)((ulong)auVar36._8_8_ & 0x8000000000000000 | 0x3fe0000000000000)
                          + auVar36._8_8_);
    uVar28 = -(ulong)(dVar32 < -dVar32);
    uVar30 = -(ulong)(dVar35 < -dVar35);
    if (((double)(~uVar30 & (ulong)dVar35 | (ulong)-dVar35 & uVar30) +
        (double)(~uVar28 & (ulong)dVar32 | (ulong)-dVar32 & uVar28)) * 2.54 <=
        (double)(~uVar29 & (ulong)dVar34 | (ulong)-dVar34 & uVar29) +
        (double)(~uVar27 & (ulong)dVar31 | (ulong)-dVar31 & uVar27)) {
      cinfo->density_unit = '\x02';
      iVar8 = QImage::dotsPerMeterX();
      cinfo->X_density =
           (short)(uint)((ulong)((long)(iVar8 + 0x32) * 0x51eb851f) >> 0x25) -
           (short)(iVar8 + 0x32 >> 0x1f);
      iVar8 = QImage::dotsPerMeterY();
      UVar7 = (UINT16)((iVar8 + 0x32) / 100);
    }
    else {
      cinfo->density_unit = '\x01';
      iVar8 = QImage::dotsPerMeterX();
      dVar31 = ((double)iVar8 * 2.54) / 100.0;
      cinfo->X_density =
           (UINT16)(int)((double)((ulong)dVar31 & 0x8000000000000000 | (ulong)DAT_0010a0e0) + dVar31
                        );
      iVar8 = QImage::dotsPerMeterY();
      dVar31 = ((double)iVar8 * 2.54) / 100.0;
      UVar7 = (UINT16)(int)((double)((ulong)dVar31 & 0x8000000000000000 | (ulong)DAT_0010a0e0) +
                           dVar31);
    }
    cinfo->Y_density = UVar7;
    if (optimize) {
      cinfo->optimize_coding = 1;
    }
    if (progressive) {
      jpeg_simple_progression(cinfo);
    }
    if (sourceQuality < 0) {
      jpeg_set_quality(cinfo,0x4b,1);
    }
    else {
      if ((uint)sourceQuality < 100) {
        jpeg_set_quality(cinfo,sourceQuality,1);
        if ((uint)sourceQuality < 0x5b) goto LAB_00107b87;
      }
      else {
        jpeg_set_quality(cinfo,100,1);
      }
      pjVar2 = cinfo->comp_info;
      pjVar2->h_samp_factor = 1;
      pjVar2->v_samp_factor = 1;
    }
LAB_00107b87:
    jpeg_start_compress(cinfo,1);
    local_1c8.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
          )(QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
            *)0xaaaaaaaaaaaaaaaa;
    qt_getImageText((QImage *)&local_1c8,(QString *)image);
    if (local_1c8.d.ptr ==
        (QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
         *)0x0) {
      p_Var16 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var16 = *(_Rb_tree_node_base **)((long)local_1c8.d.ptr + 0x20);
    }
    p_Var24 = (_Rb_tree_node_base *)((long)local_1c8.d.ptr + 0x10);
    if (local_1c8.d.ptr ==
        (QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
         *)0x0) {
      p_Var24 = (_Rb_tree_node_base *)0x0;
    }
    if (p_Var16 != p_Var24) {
      do {
        local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
        local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        QString::toUtf8_helper((QString *)&local_258);
        if (local_258.a.a.b.d.ptr != (char *)0x0) {
          QVar39.m_data = (storage_type *)0x2;
          QVar39.m_size = (qsizetype)local_258.a.a.b.d.ptr;
          QByteArray::insert((longlong)&local_258,QVar39);
        }
        QString::toUtf8_helper((QString *)&local_298);
        QByteArray::append((QByteArray *)&local_258);
        if ((QArrayData *)local_298.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_298.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_298.a.a)->d)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_298.a.a)->d)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_298.a.a,1,0x10);
          }
        }
        if ((char *)0xfffd < local_258.a.a.b.d.ptr) {
          QByteArray::truncate((longlong)&local_258);
        }
        pQVar20 = &(local_258.a.a.b.d.d)->super_QArrayData;
        if (&(local_258.a.a.b.d.d)->super_QArrayData == (QArrayData *)0x0) {
          pQVar20 = (QArrayData *)&QByteArray::_empty;
        }
        jpeg_write_marker(cinfo,0xfe,pQVar20,(ulong)local_258.a.a.b.d.ptr & 0xffffffff);
        if ((QArrayData *)local_258.a.a.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_258.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_258.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i
               + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_258.a.a.a)->d)->_q_value).super___atomic_base<int>._M_i
              == 0) {
            QArrayData::deallocate((QArrayData *)local_258.a.a.a,1,0x10);
          }
        }
        p_Var16 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var16);
      } while (p_Var16 != p_Var24);
    }
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2(&local_1c8);
    if ((cinfo->in_color_space == JCS_CMYK) || (cinfo->in_color_space == JCS_RGB)) {
      local_1b8 = -0x5555555555555556;
      local_1c8.d.ptr =
           (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
            )(QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
              *)0xaaaaaaaaaaaaaaaa;
      uStack_1c0 = 0xaaaaaaaaaaaaaaaa;
      QImage::colorSpace();
      QColorSpace::iccProfile();
      QColorSpace::~QColorSpace((QColorSpace *)&local_258);
      if (local_1b8 != 0) {
        local_1e8.d.size = -0x5555555555555556;
        local_1e8.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        local_1e8.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&local_1e8,"ICC_PROFILE",0xc);
        uVar27 = (local_1b8 + 0xffeeU) / 0xffef;
        iVar8 = (int)uVar27;
        if (0 < iVar8) {
          iVar12 = 0;
          iVar11 = 0;
          do {
            lVar23 = local_1b8 - iVar12;
            if (0xffee < lVar23) {
              lVar23 = 0xffef;
            }
            local_208.d.size = 0xaaaaaaaaaaaaaaaa;
            local_208.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_208.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            iVar11 = iVar11 + 1;
            QByteArray::QByteArray(&local_2b8,1,(char)iVar11);
            qVar6 = local_2b8.d.size;
            pcVar21 = local_2b8.d.ptr;
            pDVar5 = local_2b8.d.d;
            local_2b8.d.size = 0;
            local_2b8.d.d = (Data *)0x0;
            local_2b8.d.ptr = (char *)0x0;
            QByteArray::QByteArray(&local_2d8,1,(char)uVar27);
            local_298.b.d.size = local_2d8.d.size;
            local_298.b.d.ptr = local_2d8.d.ptr;
            local_298.b.d.d = local_2d8.d.d;
            local_298.a.a = &local_1e8;
            local_298.a.b.d.d = pDVar5;
            local_298.a.b.d.ptr = pcVar21;
            local_298.a.b.d.size = qVar6;
            local_2d8.d.d = (Data *)0x0;
            local_2d8.d.ptr = (char *)0x0;
            local_2d8.d.size = 0;
            QByteArray::mid((longlong)&local_2f8,(longlong)&local_1c8);
            local_258.a.b.d.size = local_298.b.d.size;
            local_258.a.b.d.ptr = local_298.b.d.ptr;
            local_258.a.b.d.d = local_298.b.d.d;
            local_258.a.a.b.d.ptr = local_298.a.b.d.ptr;
            local_258.a.a.b.d.d = local_298.a.b.d.d;
            local_258.b.d.size = local_2e8;
            local_258.b.d.ptr = pcStack_2f0;
            local_258.b.d.d = (Data *)local_2f8;
            local_298.a.b.d.d = (Data *)0x0;
            local_298.a.b.d.ptr = (char *)0x0;
            local_258.a.a.a = local_298.a.a;
            local_258.a.a.b.d.size = local_298.a.b.d.size;
            local_298.a.b.d.size = 0;
            local_298.b.d.d = (Data *)0x0;
            local_298.b.d.ptr = (char *)0x0;
            local_298.b.d.size = 0;
            local_2f8 = (QArrayData *)0x0;
            pcStack_2f0 = (char *)0x0;
            local_2e8 = 0;
            QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
            ::convertTo<QByteArray>(&local_208,&local_258);
            QStringBuilder<QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>,_QByteArray>
            ::~QStringBuilder(&local_258);
            if (local_2f8 != (QArrayData *)0x0) {
              LOCK();
              (local_2f8->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_2f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_2f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_2f8,1,0x10);
              }
            }
            QStringBuilder<QStringBuilder<const_QByteArray_&,_QByteArray>,_QByteArray>::
            ~QStringBuilder(&local_298);
            if (&(local_2d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_2d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_2d8.d.d)->super_QArrayData,1,0x10);
              }
            }
            if (&(local_2b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_2b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_2b8.d.d)->super_QArrayData,1,0x10);
              }
            }
            pcVar21 = local_208.d.ptr;
            if (local_208.d.ptr == (char *)0x0) {
              pcVar21 = (char *)&QByteArray::_empty;
            }
            jpeg_write_marker(cinfo,0xe2,pcVar21,local_208.d.size & 0xffffffff);
            if (&(local_208.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_208.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_208.d.d)->super_QArrayData,1,0x10);
              }
            }
            iVar12 = iVar12 + (int)lVar23;
          } while (iVar8 != iVar11);
        }
        if (&(local_1e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_1e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_1e8.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      if (local_1c8.d.ptr !=
          (QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>
           *)0x0) {
        LOCK();
        *(int *)local_1c8.d.ptr = *(int *)local_1c8.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_1c8.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_1c8.d.ptr,1,0x10);
        }
      }
    }
    uVar1 = cinfo->image_width;
    __n = (size_t)(int)uVar1;
    pJVar17 = (JSAMPROW)operator_new__((ulong)(cinfo->input_components * uVar1));
    *row_pointer = pJVar17;
    if (cinfo->next_scanline < cinfo->image_height) {
      uVar27 = (ulong)uVar1;
      do {
        pJVar17 = *row_pointer;
        iVar8 = QImage::format();
        iVar11 = (int)image;
        if (iVar8 < 0x18) {
          switch(iVar8) {
          case 1:
          case 2:
            lVar23 = QImage::constScanLine(iVar11);
            iVar8 = QImage::format();
            if (bVar26) {
              if (iVar8 == 2) {
                if (0 < (int)uVar1) {
                  uVar28 = 0;
                  do {
                    pJVar17[uVar28] =
                         *(JSAMPLE *)
                          ((ulong)((*(byte *)(lVar23 + (uVar28 >> 3 & 0x1fffffff)) >>
                                    ((uint)uVar28 & 7) & 1) != 0) * 4 + -0x5555555555555554);
                    uVar28 = uVar28 + 1;
                  } while (uVar27 != uVar28);
                }
              }
              else if (0 < (int)uVar1) {
                uVar28 = 0;
                do {
                  pJVar17[uVar28] =
                       *(JSAMPLE *)
                        ((ulong)((*(byte *)(lVar23 + (uVar28 >> 3 & 0x1fffffff)) >>
                                  (~(byte)uVar28 & 7) & 1) != 0) * 4 + -0x5555555555555554);
                  uVar28 = uVar28 + 1;
                } while (uVar27 != uVar28);
              }
            }
            else if (iVar8 == 2) {
              if (0 < (int)uVar1) {
                uVar19 = 0;
                do {
                  lVar22 = (ulong)((*(byte *)(lVar23 + (ulong)(uVar19 >> 3)) >> (uVar19 & 7) & 1) !=
                                  0) * 4;
                  *pJVar17 = *(JSAMPLE *)(lVar22 + -0x5555555555555554);
                  pJVar17[1] = *(JSAMPLE *)(lVar22 + -0x5555555555555555);
                  pJVar17[2] = *(JSAMPLE *)(lVar22 + -0x5555555555555556);
                  pJVar17 = pJVar17 + 3;
                  uVar19 = uVar19 + 1;
                } while (uVar1 != uVar19);
              }
            }
            else if (0 < (int)uVar1) {
              uVar19 = 0;
              do {
                lVar22 = (ulong)((*(byte *)(lVar23 + (ulong)(uVar19 >> 3)) >> (~(byte)uVar19 & 7) &
                                 1) != 0) * 4;
                *pJVar17 = *(JSAMPLE *)(lVar22 + -0x5555555555555554);
                pJVar17[1] = *(JSAMPLE *)(lVar22 + -0x5555555555555555);
                pJVar17[2] = *(JSAMPLE *)(lVar22 + -0x5555555555555556);
                pJVar17 = pJVar17 + 3;
                uVar19 = uVar19 + 1;
              } while (uVar1 != uVar19);
            }
            break;
          case 3:
            lVar23 = QImage::constScanLine(iVar11);
            if (bVar26) {
              if (0 < (int)uVar1) {
                lVar22 = 0;
                do {
                  pJVar17[lVar22] =
                       *(JSAMPLE *)((ulong)*(byte *)(lVar23 + lVar22) * 4 + -0x5555555555555554);
                  lVar22 = lVar22 + 1;
                } while (uVar1 != (uint)lVar22);
              }
            }
            else if (0 < (int)uVar1) {
              lVar22 = 0;
              do {
                *pJVar17 = *(JSAMPLE *)((ulong)*(byte *)(lVar23 + lVar22) * 4 + -0x5555555555555554)
                ;
                pJVar17[1] = *(JSAMPLE *)
                              ((ulong)*(byte *)(lVar23 + lVar22) * 4 + -0x5555555555555555);
                pJVar17[2] = *(JSAMPLE *)
                              ((ulong)*(byte *)(lVar23 + lVar22) * 4 + -0x5555555555555556);
                lVar22 = lVar22 + 1;
                pJVar17 = pJVar17 + 3;
              } while (uVar1 != (uint)lVar22);
            }
            break;
          case 4:
          case 5:
          case 6:
            lVar23 = QImage::constScanLine(iVar11);
            if (0 < (int)uVar1) {
              lVar22 = 0;
              do {
                *pJVar17 = *(JSAMPLE *)(lVar23 + 2 + lVar22 * 4);
                pJVar17[1] = *(JSAMPLE *)(lVar23 + 1 + lVar22 * 4);
                pJVar17[2] = *(JSAMPLE *)(lVar23 + lVar22 * 4);
                lVar22 = lVar22 + 1;
                pJVar17 = pJVar17 + 3;
              } while (uVar1 != (uint)lVar22);
            }
            break;
          default:
switchD_001081ca_caseD_7:
            local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_1c8.d.ptr =
                 (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
                  )((ulong)cinfo->next_scanline << 0x20);
            uStack_1c0 = CONCAT44(cinfo->next_scanline,uVar1 - 1);
            QImage::copy((QRect *)&local_298);
            QImage::convertToFormat
                      ((QImage *)&local_258,(Format)&local_298,(ImageConversionFlags)0x4);
            QImage::~QImage((QImage *)&local_298);
            lVar23 = QImage::constScanLine((int)&local_258);
            if (0 < (int)uVar1) {
              lVar22 = 0;
              do {
                *pJVar17 = *(JSAMPLE *)(lVar23 + 2 + lVar22 * 4);
                pJVar17[1] = *(JSAMPLE *)(lVar23 + 1 + lVar22 * 4);
                pJVar17[2] = *(JSAMPLE *)(lVar23 + lVar22 * 4);
                lVar22 = lVar22 + 1;
                pJVar17 = pJVar17 + 3;
              } while (uVar1 != (uint)lVar22);
            }
            QImage::~QImage((QImage *)&local_258);
            break;
          case 0xd:
            pvVar18 = (void *)QImage::constScanLine(iVar11);
            __n_00 = __n * 3;
LAB_001086d6:
            memcpy(pJVar17,pvVar18,__n_00);
          }
        }
        else {
          if (iVar8 == 0x18) {
            pvVar18 = (void *)QImage::constScanLine(iVar11);
            __n_00 = __n;
            goto LAB_001086d6;
          }
          if (iVar8 == 0x1c) {
            local_258.a.a.b.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.a = (QByteArray *)0xaaaaaaaaaaaaaaaa;
            local_258.a.a.b.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            local_1c8.d.ptr =
                 (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
                  )((ulong)cinfo->next_scanline << 0x20);
            uStack_1c0 = CONCAT44(cinfo->next_scanline,uVar1 - 1);
            QImage::copy((QRect *)&local_298);
            QImage::convertToFormat
                      ((QImage *)&local_258,(Format)&local_298,(ImageConversionFlags)0x18);
            QImage::~QImage((QImage *)&local_298);
            pvVar18 = (void *)QImage::constScanLine((int)&local_258);
            memcpy(pJVar17,pvVar18,__n);
            QImage::~QImage((QImage *)&local_258);
          }
          else {
            if (iVar8 != 0x24) goto switchD_001081ca_caseD_7;
            pvVar18 = (void *)QImage::constScanLine(iVar11);
            __n_00 = __n * 4;
            if (!invertCMYK) goto LAB_001086d6;
            if (0 < (int)uVar1) {
              uVar28 = 0;
              do {
                *(uint *)(pJVar17 + uVar28 * 4) = ~*(uint *)((long)pvVar18 + uVar28 * 4);
                uVar28 = uVar28 + 1;
              } while (uVar27 != uVar28);
            }
          }
        }
        jpeg_write_scanlines(cinfo,row_pointer,1);
      } while (cinfo->next_scanline < cinfo->image_height);
    }
    jpeg_finish_compress(cinfo);
  }
  else {
    my_output_message((j_common_ptr)cinfo);
  }
  jpeg_destroy_compress(cinfo);
  operator_delete(pjVar14,0x1030);
LAB_00108729:
  LOCK();
  iRamaaaaaaaaaaaaaaaa = iRamaaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (iRamaaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)0xaaaaaaaaaaaaaaaa,4,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar25;
}

Assistant:

static bool do_write_jpeg_image(struct jpeg_compress_struct &cinfo,
                                JSAMPROW *row_pointer,
                                const QImage &image,
                                QIODevice *device,
                                int sourceQuality,
                                const QString &description,
                                bool optimize,
                                bool progressive,
                                bool invertCMYK)
{
    bool success = false;
    const QList<QRgb> cmap = image.colorTable();

    if (image.format() == QImage::Format_Invalid || image.format() == QImage::Format_Alpha8)
        return false;

    struct my_jpeg_destination_mgr *iod_dest = new my_jpeg_destination_mgr(device);
    struct my_error_mgr jerr;

    cinfo.err = jpeg_std_error(&jerr);
    jerr.error_exit = my_error_exit;
    jerr.output_message = my_output_message;

    if (!setjmp(jerr.setjmp_buffer)) {
        // WARNING:
        // this if loop is inside a setjmp/longjmp branch
        // do not create C++ temporaries here because the destructor may never be called
        // if you allocate memory, make sure that you can free it (row_pointer[0])
        jpeg_create_compress(&cinfo);

        cinfo.dest = iod_dest;

        cinfo.image_width = image.width();
        cinfo.image_height = image.height();

        bool gray = false;
        switch (image.format()) {
        case QImage::Format_Mono:
        case QImage::Format_MonoLSB:
        case QImage::Format_Indexed8:
            gray = true;
            for (int i = image.colorCount(); gray && i; i--) {
                gray = gray & qIsGray(cmap[i-1]);
            }
            cinfo.input_components = gray ? 1 : 3;
            cinfo.in_color_space = gray ? JCS_GRAYSCALE : JCS_RGB;
            break;
        case QImage::Format_Grayscale8:
        case QImage::Format_Grayscale16:
            gray = true;
            cinfo.input_components = 1;
            cinfo.in_color_space = JCS_GRAYSCALE;
            break;
        case QImage::Format_CMYK8888:
            cinfo.input_components = 4;
            cinfo.in_color_space = JCS_CMYK;
            break;
        default:
            cinfo.input_components = 3;
            cinfo.in_color_space = JCS_RGB;
        }

        jpeg_set_defaults(&cinfo);

        qreal diffInch = qAbs(image.dotsPerMeterX()*2.54/100. - qRound(image.dotsPerMeterX()*2.54/100.))
                         + qAbs(image.dotsPerMeterY()*2.54/100. - qRound(image.dotsPerMeterY()*2.54/100.));
        qreal diffCm = (qAbs(image.dotsPerMeterX()/100. - qRound(image.dotsPerMeterX()/100.))
                        + qAbs(image.dotsPerMeterY()/100. - qRound(image.dotsPerMeterY()/100.)))*2.54;
        if (diffInch < diffCm) {
            cinfo.density_unit = 1; // dots/inch
            cinfo.X_density = qRound(image.dotsPerMeterX()*2.54/100.);
            cinfo.Y_density = qRound(image.dotsPerMeterY()*2.54/100.);
        } else {
            cinfo.density_unit = 2; // dots/cm
            cinfo.X_density = (image.dotsPerMeterX()+50) / 100;
            cinfo.Y_density = (image.dotsPerMeterY()+50) / 100;
        }

        if (optimize)
            cinfo.optimize_coding = true;

        if (progressive)
            jpeg_simple_progression(&cinfo);

        int quality = sourceQuality >= 0 ? qMin(int(sourceQuality),100) : 75;
        jpeg_set_quality(&cinfo, quality, TRUE /* limit to baseline-JPEG values */);

        // If the quality exceeds a certain threshold (such as 90), disable chroma subsampling
        if (quality > 90) {
            cinfo.comp_info[0].v_samp_factor = 1;
            cinfo.comp_info[0].h_samp_factor = 1;
        }

        jpeg_start_compress(&cinfo, TRUE);

        set_text(image, &cinfo, description);
        if (cinfo.in_color_space == JCS_RGB || cinfo.in_color_space == JCS_CMYK)
            write_icc_profile(image, &cinfo);

        row_pointer[0] = new uchar[cinfo.image_width*cinfo.input_components];
        int w = cinfo.image_width;
        while (cinfo.next_scanline < cinfo.image_height) {
            uchar *row = row_pointer[0];
            switch (image.format()) {
            case QImage::Format_Mono:
            case QImage::Format_MonoLSB:
                if (gray) {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            row[i] = qRed(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            row[i] = qRed(cmap[bit]);
                        }
                    }
                } else {
                    const uchar* data = image.constScanLine(cinfo.next_scanline);
                    if (image.format() == QImage::Format_MonoLSB) {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (i & 7)));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    } else {
                        for (int i=0; i<w; i++) {
                            bool bit = !!(*(data + (i >> 3)) & (1 << (7 -(i & 7))));
                            *row++ = qRed(cmap[bit]);
                            *row++ = qGreen(cmap[bit]);
                            *row++ = qBlue(cmap[bit]);
                        }
                    }
                }
                break;
            case QImage::Format_Indexed8:
                if (gray) {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row = qRed(cmap[*pix]);
                        ++row; ++pix;
                    }
                } else {
                    const uchar* pix = image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(cmap[*pix]);
                        *row++ = qGreen(cmap[*pix]);
                        *row++ = qBlue(cmap[*pix]);
                        ++pix;
                    }
                }
                break;
            case QImage::Format_Grayscale8:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w);
                break;
            case QImage::Format_Grayscale16:
                {
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_Grayscale8);
                    memcpy(row, rowImg.constScanLine(0), w);
                }
                break;
            case QImage::Format_RGB888:
                memcpy(row, image.constScanLine(cinfo.next_scanline), w * 3);
                break;
            case QImage::Format_RGB32:
            case QImage::Format_ARGB32:
            case QImage::Format_ARGB32_Premultiplied:
                {
                    const QRgb* rgb = (const QRgb*)image.constScanLine(cinfo.next_scanline);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            case QImage::Format_CMYK8888: {
                auto *cmykIn = reinterpret_cast<const quint32 *>(image.constScanLine(cinfo.next_scanline));
                auto *cmykOut = reinterpret_cast<quint32 *>(row);
                if (invertCMYK) {
                    for (int i = 0; i < w; ++i)
                        cmykOut[i] = 0xffffffffu - cmykIn[i];
                } else {
                    memcpy(cmykOut, cmykIn, w * 4);
                }
                break;
            }
            default:
                {
                    // (Testing shows that this way is actually faster than converting to RGB888 + memcpy)
                    QImage rowImg = image.copy(0, cinfo.next_scanline, w, 1).convertToFormat(QImage::Format_RGB32);
                    const QRgb* rgb = (const QRgb*)rowImg.constScanLine(0);
                    for (int i=0; i<w; i++) {
                        *row++ = qRed(*rgb);
                        *row++ = qGreen(*rgb);
                        *row++ = qBlue(*rgb);
                        ++rgb;
                    }
                }
                break;
            }
            jpeg_write_scanlines(&cinfo, row_pointer, 1);
        }

        jpeg_finish_compress(&cinfo);
        jpeg_destroy_compress(&cinfo);
        success = true;
    } else {
        my_output_message(j_common_ptr(&cinfo));
        jpeg_destroy_compress(&cinfo);
        success = false;
    }

    delete iod_dest;
    return success;
}